

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

void __thiscall caffe::BiasParameter::MergeFrom(BiasParameter *this,BiasParameter *from)

{
  uint uVar1;
  void *pvVar2;
  LogMessage *other;
  FillerParameter *this_00;
  FillerParameter *from_00;
  LogFinisher local_59;
  LogMessage local_58;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/caffe/src/caffe/proto/caffe.pb.cc"
               ,0x5164);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_58,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_59,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_58);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  uVar1 = (from->_has_bits_).has_bits_[0];
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      this_00 = this->filler_;
      if (this_00 == (FillerParameter *)0x0) {
        this_00 = (FillerParameter *)operator_new(0x40);
        FillerParameter::FillerParameter(this_00);
        this->filler_ = this_00;
      }
      from_00 = from->filler_;
      if (from_00 == (FillerParameter *)0x0) {
        from_00 = (FillerParameter *)&_FillerParameter_default_instance_;
      }
      FillerParameter::MergeFrom(this_00,from_00);
    }
    if ((uVar1 & 2) != 0) {
      this->axis_ = from->axis_;
    }
    if ((uVar1 & 4) != 0) {
      this->num_axes_ = from->num_axes_;
    }
    (this->_has_bits_).has_bits_[0] = (this->_has_bits_).has_bits_[0] | uVar1;
  }
  return;
}

Assistant:

void BiasParameter::MergeFrom(const BiasParameter& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:caffe.BiasParameter)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 7u) {
    if (cached_has_bits & 0x00000001u) {
      mutable_filler()->::caffe::FillerParameter::MergeFrom(from.filler());
    }
    if (cached_has_bits & 0x00000002u) {
      axis_ = from.axis_;
    }
    if (cached_has_bits & 0x00000004u) {
      num_axes_ = from.num_axes_;
    }
    _has_bits_[0] |= cached_has_bits;
  }
}